

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O3

bool __thiscall btLemkeAlgorithm::LexicographicPositive(btLemkeAlgorithm *this,btVectorXf *v)

{
  int iVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  btScalar bVar6;
  float fVar7;
  
  iVar1 = (v->m_storage).m_size;
  if (iVar1 < 2) {
    pfVar2 = (v->m_storage).m_data;
    uVar3 = 0;
  }
  else {
    uVar3 = iVar1 - 1;
    pfVar2 = (v->m_storage).m_data;
    uVar4 = 0;
    bVar5 = btMachEps()::calculated;
    bVar6 = btMachEps::machEps;
    do {
      if ((bVar5 & 1) == 0) {
        do {
          do {
            bVar6 = bVar6 * 0.5;
            fVar7 = bVar6 * 0.5 + 1.0;
          } while (fVar7 != 1.0);
        } while (NAN(fVar7));
        btMachEps()::calculated = 1;
        btMachEps::machEps = bVar6;
      }
      if (bVar6 <= ABS(pfVar2[uVar4])) {
        uVar3 = (uint)uVar4;
        break;
      }
      uVar4 = uVar4 + 1;
      bVar5 = 1;
    } while (uVar4 != uVar3);
  }
  return 0.0 < pfVar2[uVar3];
}

Assistant:

bool btLemkeAlgorithm::LexicographicPositive(const btVectorXu & v)
{
    int i = 0;
  //  if (DEBUGLEVEL)
    //  cout << "v " << v << endl;

    while(i < v.size()-1 && fabs(v[i]) < btMachEps())
      i++;
    if (v[i] > 0)
      return true;

    return false;
  }